

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

BufferHandle * __thiscall
duckdb::StandardBufferManager::Pin
          (BufferHandle *__return_storage_ptr__,StandardBufferManager *this,
          shared_ptr<duckdb::BlockHandle,_true> *handle)

{
  MemoryTag tag;
  StringUtil *this_00;
  bool bVar1;
  BlockHandle *pBVar2;
  BufferPoolReservation *this_01;
  unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *this_02;
  pointer pFVar3;
  long lVar4;
  long lVar5;
  idx_t in_RCX;
  BlockLock lock_1;
  BlockLock lock;
  TempBufferPoolReservation reservation;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_b0;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_a8;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_a0;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_98;
  unique_lock<std::mutex> local_90;
  undefined1 local_80 [24];
  BufferPoolReservation local_68;
  string local_50;
  
  BufferHandle::BufferHandle(__return_storage_ptr__);
  pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
  local_80._0_8_ = &pBVar2->lock;
  local_80[8] = false;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_80);
  local_80[8] = true;
  pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
  if ((pBVar2->state)._M_i == BLOCK_LOADED) {
    pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
    local_98._M_head_impl = (FileBuffer *)0x0;
    BlockHandle::Load((BufferHandle *)&local_68,pBVar2,
                      (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                       *)&local_98);
    BufferHandle::operator=(__return_storage_ptr__,(BufferHandle *)&local_68);
    BufferHandle::~BufferHandle((BufferHandle *)&local_68);
    if (local_98._M_head_impl != (FileBuffer *)0x0) {
      (*(local_98._M_head_impl)->_vptr_FileBuffer[1])();
    }
    local_98._M_head_impl = (FileBuffer *)0x0;
  }
  pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
  this_00 = (StringUtil *)(pBVar2->memory_usage).super___atomic_base<unsigned_long>._M_i;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_80);
  bVar1 = BufferHandle::IsValid(__return_storage_ptr__);
  if (!bVar1) {
    local_b0._M_head_impl = (FileBuffer *)0x0;
    pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
    tag = pBVar2->tag;
    StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,this_00,0x400,in_RCX);
    EvictBlocksOrThrow<char_const*,std::__cxx11::string>
              ((TempBufferPoolReservation *)&local_68,this,tag,(idx_t)this_00,
               (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
               &local_b0,"failed to pin block of size %s%s",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
    local_90._M_device = &pBVar2->lock;
    local_90._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_90);
    local_90._M_owns = true;
    pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
    if ((pBVar2->state)._M_i == BLOCK_LOADED) {
      BufferPoolReservation::Resize(&local_68,0);
      pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
      local_a0._M_head_impl = (FileBuffer *)0x0;
      BlockHandle::Load((BufferHandle *)local_80,pBVar2,
                        (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                         *)&local_a0);
      BufferHandle::operator=(__return_storage_ptr__,(BufferHandle *)local_80);
      BufferHandle::~BufferHandle((BufferHandle *)local_80);
      if (local_a0._M_head_impl != (FileBuffer *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_FileBuffer[1])();
      }
      local_a0._M_head_impl = (FileBuffer *)0x0;
    }
    else {
      pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
      local_a8._M_head_impl = local_b0._M_head_impl;
      local_b0._M_head_impl = (FileBuffer *)0x0;
      BlockHandle::Load((BufferHandle *)local_80,pBVar2,
                        (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                         *)&local_a8);
      BufferHandle::operator=(__return_storage_ptr__,(BufferHandle *)local_80);
      BufferHandle::~BufferHandle((BufferHandle *)local_80);
      if (local_a8._M_head_impl != (FileBuffer *)0x0) {
        (*(local_a8._M_head_impl)->_vptr_FileBuffer[1])();
      }
      local_a8._M_head_impl = (FileBuffer *)0x0;
      pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
      this_01 = BlockHandle::GetMemoryCharge(pBVar2,&local_90);
      BufferPoolReservation::operator=(this_01,&local_68);
      pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
      this_02 = BlockHandle::GetBuffer(pBVar2,&local_90);
      pFVar3 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
               operator->(this_02);
      lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pFVar3->internal_size);
      pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
      lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        ((pBVar2->memory_usage).super___atomic_base<unsigned_long>._M_i);
      if (lVar4 - lVar5 != 0) {
        pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->(handle);
        BlockHandle::ChangeMemoryUsage(pBVar2,&local_90,lVar4 - lVar5);
      }
    }
    ::std::unique_lock<std::mutex>::~unique_lock(&local_90);
    TempBufferPoolReservation::~TempBufferPoolReservation((TempBufferPoolReservation *)&local_68);
    if (local_b0._M_head_impl != (FileBuffer *)0x0) {
      (*(local_b0._M_head_impl)->_vptr_FileBuffer[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BufferHandle StandardBufferManager::Pin(shared_ptr<BlockHandle> &handle) {
	// we need to be careful not to return the BufferHandle to this block while holding the BlockHandle's lock
	// as exiting this function's scope may cause the destructor of the BufferHandle to be called while holding the lock
	// the destructor calls Unpin, which grabs the BlockHandle's lock again, causing a deadlock
	BufferHandle buf;

	idx_t required_memory;
	{
		// lock the block
		auto lock = handle->GetLock();
		// check if the block is already loaded
		if (handle->GetState() == BlockState::BLOCK_LOADED) {
			// the block is loaded, increment the reader count and set the BufferHandle
			buf = handle->Load();
		}
		required_memory = handle->GetMemoryUsage();
	}

	if (buf.IsValid()) {
		return buf; // the block was already loaded, return it without holding the BlockHandle's lock
	} else {
		// evict blocks until we have space for the current block
		unique_ptr<FileBuffer> reusable_buffer;
		auto reservation = EvictBlocksOrThrow(handle->GetMemoryTag(), required_memory, &reusable_buffer,
		                                      "failed to pin block of size %s%s",
		                                      StringUtil::BytesToHumanReadableString(required_memory));

		// lock the handle again and repeat the check (in case anybody loaded in the meantime)
		auto lock = handle->GetLock();
		// check if the block is already loaded
		if (handle->GetState() == BlockState::BLOCK_LOADED) {
			// the block is loaded, increment the reader count and return a pointer to the handle
			reservation.Resize(0);
			buf = handle->Load();
		} else {
			// now we can actually load the current block
			D_ASSERT(handle->Readers() == 0);
			buf = handle->Load(std::move(reusable_buffer));
			auto &memory_charge = handle->GetMemoryCharge(lock);
			memory_charge = std::move(reservation);
			// in the case of a variable sized block, the buffer may be smaller than a full block.
			int64_t delta = NumericCast<int64_t>(handle->GetBuffer(lock)->AllocSize()) -
			                NumericCast<int64_t>(handle->GetMemoryUsage());
			if (delta) {
				handle->ChangeMemoryUsage(lock, delta);
			}
			D_ASSERT(handle->GetMemoryUsage() == handle->GetBuffer(lock)->AllocSize());
		}
	}

	// we should have a valid BufferHandle by now, either because the block was already loaded, or because we loaded it
	// return it without holding the BlockHandle's lock
	D_ASSERT(buf.IsValid());
	return buf;
}